

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_expression.cpp
# Opt level: O3

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformExpression(Transformer *this,PGNode *node)

{
  PGNodeTag PVar1;
  Transformer *pTVar2;
  NotImplementedException *this_00;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> uVar3;
  PGNodeTag *in_RDX;
  char unaff_BPL;
  PGAConst *c;
  pointer unaff_R12;
  StackChecker<duckdb::Transformer> stack_checker;
  undefined1 local_78 [16];
  string local_68;
  string local_48;
  
  pTVar2 = (Transformer *)local_78;
  c = (PGAConst *)node;
  StackCheck((Transformer *)local_78,(idx_t)node);
  PVar1 = *in_RDX;
  if ((int)PVar1 < 0x161) {
    if ((int)PVar1 < 0x71) {
      if (PVar1 == T_PGGroupingFunc) {
        TransformGroupingFunction(this,(PGGroupingFunc *)node);
      }
      else if (PVar1 == T_PGNamedArgExpr) {
        TransformNamedArg(this,(PGNamedArgExpr *)node);
      }
      else {
        if (PVar1 != T_PGBoolExpr) goto switchD_00ca6861_caseD_167;
        TransformBoolExpr(this,(PGBoolExpr *)node);
      }
    }
    else {
      switch(PVar1) {
      case T_PGCaseExpr:
        TransformCase(this,(PGCaseExpr *)node);
        break;
      case T_PGCaseWhen:
      case T_PGCaseTestExpr:
      case T_PGArrayExpr:
      case T_PGRowExpr:
      case T_PGRowCompareExpr:
      case T_PGMinMaxExpr:
      case T_PGXmlExpr:
      case T_PGCoerceToDomain:
      case T_PGCoerceToDomainValue:
        goto switchD_00ca6861_caseD_167;
      case T_PGCoalesceExpr:
        TransformCoalesce(this,(PGAExpr *)node);
        break;
      case T_PGSQLValueFunction:
        uVar3 = TransformSQLValueFunction(pTVar2,(PGSQLValueFunction *)c);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        if (local_68._M_dataplus._M_p != unaff_R12) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        if (unaff_BPL != '\0') {
          __cxa_free_exception(this);
        }
        *(idx_t *)(local_78._0_8_ + 200) = *(idx_t *)(local_78._0_8_ + 200) - local_78._8_8_;
        _Unwind_Resume(uVar3.
                       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl);
      case T_PGNullTest:
        TransformNullTest(this,(PGNullTest *)node);
        break;
      case T_PGBooleanTest:
        TransformBooleanTest(this,(PGBooleanTest *)node);
        break;
      case T_PGSetToDefault:
        pTVar2 = (Transformer *)operator_new(0x38);
        DefaultExpression::DefaultExpression((DefaultExpression *)pTVar2);
        (this->parent).ptr = pTVar2;
        break;
      default:
        if (PVar1 == T_PGSubLink) {
          TransformSubquery(this,(PGSubLink *)node);
        }
        else {
          if (PVar1 != T_PGLambdaFunction) goto switchD_00ca6861_caseD_167;
          TransformLambda(this,(PGLambdaFunction *)node);
        }
      }
    }
  }
  else {
    switch(PVar1) {
    case T_PGAExpr:
      TransformAExpr(this,(PGAExpr *)node);
      break;
    case T_PGColumnRef:
      TransformColumnRef(this,(PGColumnRef *)node);
      break;
    case T_PGParamRef:
      TransformParamRef(this,(PGParamRef *)node);
      break;
    case T_PGAConst:
      TransformConstant(this,c);
      break;
    case T_PGFuncCall:
      TransformFuncCall(this,(PGFuncCall *)node);
      break;
    case T_PGAStar:
      TransformStarExpression(this,(PGAStar *)node);
      break;
    case T_PGAIndices:
    case T_PGAArrayExpr:
switchD_00ca6861_caseD_167:
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_78 + 0x10),"Expression type %s (%d)","");
      NodetypeToString_abi_cxx11_(&local_48,(Transformer *)node,*in_RDX);
      NotImplementedException::NotImplementedException<std::__cxx11::string,int>
                (this_00,(string *)(local_78 + 0x10),&local_48,*in_RDX);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    case T_PGAIndirection:
      TransformArrayAccess(this,(PGAIndirection *)node);
      break;
    case T_PGResTarget:
      TransformResTarget(this,(PGResTarget *)node);
      break;
    case T_PGMultiAssignRef:
      TransformMultiAssignRef(this,(PGMultiAssignRef *)node);
      break;
    case T_PGTypeCast:
      TransformTypeCast(this,(PGTypeCast *)node);
      break;
    case T_PGCollateClause:
      TransformCollateExpr(this,(PGCollateClause *)node);
      break;
    default:
      if (PVar1 == T_PGIntervalConstant) {
        TransformInterval(this,(PGIntervalConstant *)node);
      }
      else {
        if (PVar1 != T_PGPositionalReference) goto switchD_00ca6861_caseD_167;
        TransformPositionalReference(this,(PGPositionalReference *)c);
      }
    }
  }
  *(idx_t *)(local_78._0_8_ + 200) = *(idx_t *)(local_78._0_8_ + 200) - local_78._8_8_;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformExpression(duckdb_libpgquery::PGNode &node) {

	auto stack_checker = StackCheck();

	switch (node.type) {
	case duckdb_libpgquery::T_PGColumnRef:
		return TransformColumnRef(PGCast<duckdb_libpgquery::PGColumnRef>(node));
	case duckdb_libpgquery::T_PGAConst:
		return TransformConstant(PGCast<duckdb_libpgquery::PGAConst>(node));
	case duckdb_libpgquery::T_PGAExpr:
		return TransformAExpr(PGCast<duckdb_libpgquery::PGAExpr>(node));
	case duckdb_libpgquery::T_PGFuncCall:
		return TransformFuncCall(PGCast<duckdb_libpgquery::PGFuncCall>(node));
	case duckdb_libpgquery::T_PGBoolExpr:
		return TransformBoolExpr(PGCast<duckdb_libpgquery::PGBoolExpr>(node));
	case duckdb_libpgquery::T_PGTypeCast:
		return TransformTypeCast(PGCast<duckdb_libpgquery::PGTypeCast>(node));
	case duckdb_libpgquery::T_PGCaseExpr:
		return TransformCase(PGCast<duckdb_libpgquery::PGCaseExpr>(node));
	case duckdb_libpgquery::T_PGSubLink:
		return TransformSubquery(PGCast<duckdb_libpgquery::PGSubLink>(node));
	case duckdb_libpgquery::T_PGCoalesceExpr:
		return TransformCoalesce(PGCast<duckdb_libpgquery::PGAExpr>(node));
	case duckdb_libpgquery::T_PGNullTest:
		return TransformNullTest(PGCast<duckdb_libpgquery::PGNullTest>(node));
	case duckdb_libpgquery::T_PGResTarget:
		return TransformResTarget(PGCast<duckdb_libpgquery::PGResTarget>(node));
	case duckdb_libpgquery::T_PGParamRef:
		return TransformParamRef(PGCast<duckdb_libpgquery::PGParamRef>(node));
	case duckdb_libpgquery::T_PGNamedArgExpr:
		return TransformNamedArg(PGCast<duckdb_libpgquery::PGNamedArgExpr>(node));
	case duckdb_libpgquery::T_PGSQLValueFunction:
		return TransformSQLValueFunction(PGCast<duckdb_libpgquery::PGSQLValueFunction>(node));
	case duckdb_libpgquery::T_PGSetToDefault:
		return make_uniq<DefaultExpression>();
	case duckdb_libpgquery::T_PGCollateClause:
		return TransformCollateExpr(PGCast<duckdb_libpgquery::PGCollateClause>(node));
	case duckdb_libpgquery::T_PGIntervalConstant:
		return TransformInterval(PGCast<duckdb_libpgquery::PGIntervalConstant>(node));
	case duckdb_libpgquery::T_PGLambdaFunction:
		return TransformLambda(PGCast<duckdb_libpgquery::PGLambdaFunction>(node));
	case duckdb_libpgquery::T_PGAIndirection:
		return TransformArrayAccess(PGCast<duckdb_libpgquery::PGAIndirection>(node));
	case duckdb_libpgquery::T_PGPositionalReference:
		return TransformPositionalReference(PGCast<duckdb_libpgquery::PGPositionalReference>(node));
	case duckdb_libpgquery::T_PGGroupingFunc:
		return TransformGroupingFunction(PGCast<duckdb_libpgquery::PGGroupingFunc>(node));
	case duckdb_libpgquery::T_PGAStar:
		return TransformStarExpression(PGCast<duckdb_libpgquery::PGAStar>(node));
	case duckdb_libpgquery::T_PGBooleanTest:
		return TransformBooleanTest(PGCast<duckdb_libpgquery::PGBooleanTest>(node));
	case duckdb_libpgquery::T_PGMultiAssignRef:
		return TransformMultiAssignRef(PGCast<duckdb_libpgquery::PGMultiAssignRef>(node));

	default:
		throw NotImplementedException("Expression type %s (%d)", NodetypeToString(node.type), (int)node.type);
	}
}